

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

void __thiscall
Model::get_gaussian_grad
          (Model *this,double **g,double label,double sigma,int centerId,int contextId,
          double current_lr)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  void *pvVar4;
  double dVar5;
  uint local_70;
  uint local_6c;
  int d_3;
  int d_2;
  int d_1;
  int d;
  double var;
  double *z;
  double *diff;
  double e;
  double eta;
  double current_lr_local;
  int contextId_local;
  int centerId_local;
  double sigma_local;
  double label_local;
  double **g_local;
  Model *this_local;
  
  auVar1 = ZEXT416(this->dim_size) * ZEXT816(8);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  auVar1 = ZEXT416(this->dim_size) * ZEXT816(8);
  uVar2 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar2);
  for (d_2 = 0; (uint)d_2 < this->dim_size; d_2 = d_2 + 1) {
    *(double *)((long)pvVar4 + (long)d_2 * 8) =
         this->emb1[contextId][d_2] - this->emb0[centerId][d_2];
  }
  e = 0.0;
  for (d_3 = 0; (uint)d_3 < this->dim_size; d_3 = d_3 + 1) {
    e = *(double *)((long)pvVar4 + (long)d_3 * 8) * *(double *)((long)pvVar4 + (long)d_3 * 8) + e;
  }
  dVar5 = exp(-e / (sigma * sigma * 2.0));
  for (local_6c = 0; local_6c < this->dim_size; local_6c = local_6c + 1) {
    *(double *)((long)pvVar3 + (long)(int)local_6c * 8) =
         (label - dVar5) * 2.0 * dVar5 *
         (*(double *)((long)pvVar4 + (long)(int)local_6c * 8) / (sigma * sigma));
  }
  for (local_70 = 0; local_70 < this->dim_size; local_70 = local_70 + 1) {
    (*g)[(int)local_70] = -current_lr * *(double *)((long)pvVar3 + (long)(int)local_70 * 8);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  return;
}

Assistant:

void Model::get_gaussian_grad(double *&g, double label, double sigma, int centerId, int contextId, double current_lr) {

    double eta, e, *diff,  *z;
    z = new double[this->dim_size];
    diff = new double[this->dim_size];

    double var = sigma * sigma;

    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d];

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];

    e = exp( -eta/(2.0*var) );
    for (int d = 0; d < this->dim_size; d++)
        z[d] = 2.0 * ( label-e  ) * ( e ) * ( diff[d]/var );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

    delete [] diff;
    delete [] z;

}